

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O1

size_t sei_render(sei_t *sei,uint8_t *data)

{
  sei_msgtype_t sVar1;
  int iVar2;
  size_t sVar3;
  uint8_t *__s;
  sei_msgtype_t sVar4;
  uint8_t *__s_00;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  size_t sVar8;
  sei_message_t *psVar9;
  
  if ((sei == (sei_t *)0x0) || (sei->head == (sei_message_t *)0x0)) {
LAB_00106d95:
    sVar8 = 0;
  }
  else {
    *data = '\x06';
    __s = data + 1;
    sVar8 = 2;
    for (psVar9 = sei->head; psVar9 != (sei_message_t *)0x0; psVar9 = psVar9->next) {
      iVar7 = (int)psVar9->size;
      sVar4 = psVar9->type;
      if (0xfe < (int)sVar4) {
        sVar1 = 0x1fd;
        if ((int)sVar4 < 0x1fd) {
          sVar1 = sVar4;
        }
        uVar5 = (sVar4 - sVar1) + 0xfe;
        memset(__s,0xff,(ulong)(uVar5 / 0xff + 1));
        sVar8 = sVar8 + (ulong)uVar5 / 0xff + 1;
        __s = __s + (ulong)uVar5 / 0xff + 1;
        sVar4 = (sVar4 + uVar5 / 0xff) - 0xff;
      }
      *__s = (uint8_t)sVar4;
      __s_00 = __s + 1;
      if (0xfe < iVar7) {
        iVar2 = 0x1fd;
        if (iVar7 < 0x1fd) {
          iVar2 = iVar7;
        }
        uVar5 = (iVar7 - iVar2) + 0xfe;
        uVar6 = (ulong)uVar5 / 0xff;
        memset(__s_00,0xff,(ulong)(uVar5 / 0xff + 1));
        sVar8 = sVar8 + uVar6 + 1;
        __s_00 = __s + uVar6 + 2;
        __s = __s + uVar6 + 1;
        iVar7 = iVar7 + uVar5 / 0xff + (uVar5 / 0xff) * -0x100 + -0xff;
      }
      *__s_00 = (uint8_t)iVar7;
      sVar3 = _copy_from_rbsp(__s + 2,(uint8_t *)(psVar9 + 1),(long)iVar7);
      if (sVar3 == 0) goto LAB_00106d95;
      sVar8 = sVar8 + sVar3 + 2;
      __s = __s + 2 + sVar3;
    }
    *__s = 0x80;
  }
  return sVar8;
}

Assistant:

size_t sei_render(sei_t* sei, uint8_t* data)
{
    if (!sei || !sei->head) {
        return 0;
    }

    size_t escaped_size, size = 2; // nalu_type + stop bit
    sei_message_t* msg;
    (*data) = 6;
    ++data;

    for (msg = sei_message_head(sei); msg; msg = sei_message_next(msg)) {
        int payloadType = sei_message_type(msg);
        int payloadSize = (int)sei_message_size(msg);
        uint8_t* payloadData = sei_message_data(msg);

        while (255 <= payloadType) {
            (*data) = 255;
            ++data;
            ++size;
            payloadType -= 255;
        }

        (*data) = payloadType;
        ++data;
        ++size;

        while (255 <= payloadSize) {
            (*data) = 255;
            ++data;
            ++size;
            payloadSize -= 255;
        }

        (*data) = payloadSize;
        ++data;
        ++size;

        if (0 >= (escaped_size = _copy_from_rbsp(data, payloadData, payloadSize))) {
            return 0;
        }

        data += escaped_size;
        size += escaped_size;
    }

    // write stop bit and return
    (*data) = 0x80;
    return size;
}